

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStringTemplateCallsiteConstant
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,Var var)

{
  uint32 uVar1;
  uint32 uVar2;
  JavascriptArray *pJVar3;
  Var aValue;
  uint32 i;
  uint uVar4;
  void *local_38;
  Var element;
  
  pJVar3 = &VarTo<Js::ES5Array>(var)->super_JavascriptArray;
  local_38 = (Var)0x0;
  uVar1 = PrependInt32(this,builder,L"String Template Callsite Constant String Count",
                       (pJVar3->super_ArrayObject).length,(BufferBuilderInt32 **)0x0);
  for (uVar4 = 0; uVar4 < (pJVar3->super_ArrayObject).length; uVar4 = uVar4 + 1) {
    JavascriptArray::DirectGetItemAt<void*>(pJVar3,uVar4,&local_38);
    uVar2 = PrependStringConstant(this,builder,local_38);
    uVar1 = uVar1 + uVar2;
  }
  aValue = JavascriptOperators::OP_GetProperty
                     (pJVar3,0x12a,
                      (((((pJVar3->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                          type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                      scriptContext.ptr);
  pJVar3 = &VarTo<Js::ES5Array>(aValue)->super_JavascriptArray;
  for (uVar4 = 0; uVar4 < (pJVar3->super_ArrayObject).length; uVar4 = uVar4 + 1) {
    JavascriptArray::DirectGetItemAt<void*>(pJVar3,uVar4,&local_38);
    uVar2 = PrependStringConstant(this,builder,local_38);
    uVar1 = uVar1 + uVar2;
  }
  return uVar1;
}

Assistant:

uint32 PrependStringTemplateCallsiteConstant(BufferBuilderList & builder, Var var)
    {
        ES5Array* callsite = VarTo<ES5Array>(var);
        Var element = nullptr;
        auto size = PrependInt32(builder, _u("String Template Callsite Constant String Count"), (int)callsite->GetLength());

        for (uint32 i = 0; i < callsite->GetLength(); i++)
        {
            callsite->DirectGetItemAt(i, &element);
            size += PrependStringConstant(builder, element);
        }

        Var rawVar = JavascriptOperators::OP_GetProperty(callsite, Js::PropertyIds::raw, callsite->GetScriptContext());
        ES5Array* rawArray = VarTo<ES5Array>(rawVar);

        for (uint32 i = 0; i < rawArray->GetLength(); i++)
        {
            rawArray->DirectGetItemAt(i, &element);
            size += PrependStringConstant(builder, element);
        }

        return size;
    }